

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<char> * __thiscall kj::Array<char>::operator=(Array<char> *this,Array<char> *other)

{
  Array<char> *other_local;
  Array<char> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (char *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }